

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O2

int mbedtls_ctr_drbg_self_test(int verbose)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uchar buf [16];
  mbedtls_ctr_drbg_context ctx;
  
  memset(&ctx,0,0x158);
  if (verbose != 0) {
    printf("  CTR_DRBG (PR = TRUE) : ");
  }
  test_offset = 0;
  iVar1 = mbedtls_ctr_drbg_seed_entropy_len
                    (&ctx,ctr_drbg_self_test_entropy,entropy_source_pr,nonce_pers_pr,0x10,0x20);
  if (iVar1 == 0) {
    ctx.prediction_resistance = 1;
    iVar1 = mbedtls_ctr_drbg_random(&ctx,buf,0x10);
    if (((iVar1 == 0) && (iVar1 = mbedtls_ctr_drbg_random(&ctx,buf,0x10), iVar1 == 0)) &&
       (auVar2[0] = -(buf[0] == '4'), auVar2[1] = -(buf[1] == '\x01'),
       auVar2[2] = -(buf[2] == '\x16'), auVar2[3] = -(buf[3] == 'V'), auVar2[4] = -(buf[4] == 0xb4),
       auVar2[5] = -(buf[5] == ')'), auVar2[6] = -(buf[6] == '\0'), auVar2[7] = -(buf[7] == 0x8f),
       auVar2[8] = -(buf[8] == '5'), auVar2[9] = -(buf[9] == 'c'), auVar2[10] = -(buf[10] == 0xec),
       auVar2[0xb] = -(buf[0xb] == 0xb5), auVar2[0xc] = -(buf[0xc] == 0xf2),
       auVar2[0xd] = -(buf[0xd] == 'Y'), auVar2[0xe] = -(buf[0xe] == '\a'),
       auVar2[0xf] = -(buf[0xf] == '#'),
       (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(auVar2[0xf] >> 7) << 0xf)
       == 0xffff)) {
      mbedtls_ctr_drbg_free(&ctx);
      if (verbose != 0) {
        puts("passed");
        printf("  CTR_DRBG (PR = FALSE): ");
      }
      memset(&ctx,0,0x158);
      test_offset = 0;
      iVar1 = mbedtls_ctr_drbg_seed_entropy_len
                        (&ctx,ctr_drbg_self_test_entropy,entropy_source_nopr,nonce_pers_nopr,0x10,
                         0x20);
      if (((iVar1 == 0) && (iVar1 = mbedtls_ctr_drbg_random(&ctx,buf,0x10), iVar1 == 0)) &&
         ((iVar1 = mbedtls_ctr_drbg_reseed(&ctx,(uchar *)0x0,0), iVar1 == 0 &&
          ((iVar1 = mbedtls_ctr_drbg_random(&ctx,buf,0x10), iVar1 == 0 &&
           (auVar3[0] = -(buf[0] == 0xa0), auVar3[1] = -(buf[1] == 'T'),
           auVar3[2] = -(buf[2] == '0'), auVar3[3] = -(buf[3] == '='), auVar3[4] = -(buf[4] == 0x8a)
           , auVar3[5] = -(buf[5] == '~'), auVar3[6] = -(buf[6] == 0xa9),
           auVar3[7] = -(buf[7] == 0x88), auVar3[8] = -(buf[8] == 0x9d),
           auVar3[9] = -(buf[9] == 0x90), auVar3[10] = -(buf[10] == '>'),
           auVar3[0xb] = -(buf[0xb] == '\a'), auVar3[0xc] = -(buf[0xc] == '|'),
           auVar3[0xd] = -(buf[0xd] == 'o'), auVar3[0xe] = -(buf[0xe] == '!'),
           auVar3[0xf] = -(buf[0xf] == 0x8f),
           (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff)))))) {
        mbedtls_ctr_drbg_free(&ctx);
        if (verbose == 0) {
          return 0;
        }
        puts("passed");
        putchar(10);
        return 0;
      }
    }
  }
  if (verbose != 0) {
    puts("failed");
  }
  return 1;
}

Assistant:

int mbedtls_ctr_drbg_self_test( int verbose )
{
    mbedtls_ctr_drbg_context ctx;
    unsigned char buf[16];

    mbedtls_ctr_drbg_init( &ctx );

    /*
     * Based on a NIST CTR_DRBG test vector (PR = True)
     */
    if( verbose != 0 )
        mbedtls_printf( "  CTR_DRBG (PR = TRUE) : " );

    test_offset = 0;
    CHK( mbedtls_ctr_drbg_seed_entropy_len( &ctx, ctr_drbg_self_test_entropy,
                                (void *) entropy_source_pr, nonce_pers_pr, 16, 32 ) );
    mbedtls_ctr_drbg_set_prediction_resistance( &ctx, MBEDTLS_CTR_DRBG_PR_ON );
    CHK( mbedtls_ctr_drbg_random( &ctx, buf, MBEDTLS_CTR_DRBG_BLOCKSIZE ) );
    CHK( mbedtls_ctr_drbg_random( &ctx, buf, MBEDTLS_CTR_DRBG_BLOCKSIZE ) );
    CHK( memcmp( buf, result_pr, MBEDTLS_CTR_DRBG_BLOCKSIZE ) );

    mbedtls_ctr_drbg_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    /*
     * Based on a NIST CTR_DRBG test vector (PR = FALSE)
     */
    if( verbose != 0 )
        mbedtls_printf( "  CTR_DRBG (PR = FALSE): " );

    mbedtls_ctr_drbg_init( &ctx );

    test_offset = 0;
    CHK( mbedtls_ctr_drbg_seed_entropy_len( &ctx, ctr_drbg_self_test_entropy,
                            (void *) entropy_source_nopr, nonce_pers_nopr, 16, 32 ) );
    CHK( mbedtls_ctr_drbg_random( &ctx, buf, 16 ) );
    CHK( mbedtls_ctr_drbg_reseed( &ctx, NULL, 0 ) );
    CHK( mbedtls_ctr_drbg_random( &ctx, buf, 16 ) );
    CHK( memcmp( buf, result_nopr, 16 ) );

    mbedtls_ctr_drbg_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
            mbedtls_printf( "\n" );

    return( 0 );
}